

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetIndexBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pIndexBuffer,
          Uint64 ByteOffset,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  Uint32 *pUVar1;
  BufferVkImpl *pBVar2;
  char *pcVar3;
  COMMAND_QUEUE_TYPE CVar4;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  COMMAND_QUEUE_TYPE extraout_DL_01;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  string local_68;
  String local_48;
  
  if (pIndexBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pIndexBuffer);
  }
  RefCntAutoPtr<Diligent::BufferVkImpl>::operator=
            (&this->m_pIndexBuffer,(BufferVkImpl *)pIndexBuffer);
  this->m_IndexDataStartOffset = ByteOffset;
  CVar4 = (this->m_Desc).QueueType;
  Type = extraout_DL;
  if (CVar4 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_68,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"SetIndexBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x344);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_68,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x344);
    Type = extraout_DL_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      Type = extraout_DL_01;
    }
    CVar4 = (this->m_Desc).QueueType;
  }
  if ((~CVar4 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar4,Type);
    in_R8 = " queue.";
    FormatString<char[15],char[22],std::__cxx11::string,char[8]>
              (&local_68,(Diligent *)"SetIndexBuffer",(char (*) [15])0x7529da,
               (char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x344);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0)) {
    FormatString<char[188]>
              (&local_68,
               (char (*) [188])
               "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  pBVar2 = (this->m_pIndexBuffer).m_pObject;
  if ((pBVar2 != (BufferVkImpl *)0x0) &&
     (((pBVar2->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.BindFlags & BIND_INDEX_BUFFER) == BIND_NONE)) {
    pcVar3 = (pBVar2->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
    local_48._M_dataplus._M_p = "";
    if (pcVar3 != (char *)0x0) {
      local_48._M_dataplus._M_p = pcVar3;
    }
    FormatString<char[9],char_const*,char[74]>
              (&local_68,(Diligent *)0x6a62a9,(char (*) [9])&local_48,
               (char **)"\' being bound as index buffer was not created with BIND_INDEX_BUFFER flag"
               ,(char (*) [74])in_R8);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"SetIndexBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x34e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.SetIndexBuffer;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetIndexBuffer(
    IBuffer*                       pIndexBuffer,
    Uint64                         ByteOffset,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    m_pIndexBuffer         = ClassPtrCast<BufferImplType>(pIndexBuffer);
    m_IndexDataStartOffset = ByteOffset;

#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetIndexBuffer");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (m_pIndexBuffer)
    {
        const BufferDesc& BuffDesc = m_pIndexBuffer->GetDesc();
        DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_INDEX_BUFFER) != 0,
                      "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as index buffer was not created with BIND_INDEX_BUFFER flag");
    }
#endif

    ++m_Stats.CommandCounters.SetIndexBuffer;
}